

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

void __thiscall asmjit::HostRuntime::HostRuntime(HostRuntime *this)

{
  CpuInfo *pCVar1;
  Runtime *in_RDI;
  int kIsModernOS;
  uint32_t alignment;
  
  Runtime::Runtime(in_RDI);
  in_RDI->_vptr_Runtime = (_func_int **)&PTR__HostRuntime_0028cbe0;
  in_RDI->_runtimeType = '\x01';
  pCVar1 = CpuInfo::getHost();
  (in_RDI->_codeInfo)._archInfo.field_0 = (pCVar1->_archInfo).field_0;
  (in_RDI->_codeInfo).field_1.field_0._stackAlignment = '\x10';
  (in_RDI->_codeInfo).field_1.field_0._cdeclCallConv = '!';
  (in_RDI->_codeInfo).field_1.field_0._stdCallConv = '!';
  (in_RDI->_codeInfo).field_1.field_0._fastCallConv = '!';
  return;
}

Assistant:

HostRuntime::HostRuntime() noexcept {
  _runtimeType = kRuntimeJit;

  // Setup the CodeInfo of this Runtime.
  _codeInfo._archInfo       = CpuInfo::getHost().getArchInfo();
  _codeInfo._stackAlignment = static_cast<uint8_t>(hostDetectNaturalStackAlignment());
  _codeInfo._cdeclCallConv  = CallConv::kIdHostCDecl;
  _codeInfo._stdCallConv    = CallConv::kIdHostStdCall;
  _codeInfo._fastCallConv   = CallConv::kIdHostFastCall;
}